

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraSublimeTextGenerator::AppendAllTargets
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,cmMakefile *mf,
          cmGeneratedFileStream *fout,MapSourceFileFlags *sourceFileFlags)

{
  cmMakefile *makefile;
  bool bVar1;
  TargetType TVar2;
  int iVar3;
  char *pcVar4;
  string *psVar5;
  char *__s2;
  long lVar6;
  pointer ppcVar7;
  pointer ppcVar8;
  string targetName;
  string make;
  string compiler;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  string fastTarget;
  char *in_stack_ffffffffffffff00;
  string local_d0;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *local_b0;
  char *local_a8 [4];
  string local_88;
  _Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_68;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_88,"CMAKE_MAKE_PROGRAM",(allocator *)&local_d0);
  pcVar4 = cmMakefile::GetRequiredDefinition(mf,&local_88);
  std::__cxx11::string::string((string *)local_a8,pcVar4,(allocator *)&local_50);
  std::__cxx11::string::~string((string *)&local_88);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  ppcVar7 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (ppcVar7 !=
      (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&local_d0,"all",(allocator *)&local_50);
    AppendTarget(this,fout,&local_d0,
                 *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,(cmGeneratorTarget *)0x0,local_a8[0],mf,
                 in_stack_ffffffffffffff00,sourceFileFlags,true);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::string((string *)&local_d0,"clean",(allocator *)&local_50);
    AppendTarget(this,fout,&local_d0,
                 *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,(cmGeneratorTarget *)0x0,local_a8[0],mf,
                 in_stack_ffffffffffffff00,sourceFileFlags,false);
    std::__cxx11::string::~string((string *)&local_d0);
    ppcVar7 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
  }
  local_b0 = lgs;
  do {
    if (ppcVar7 ==
        (local_b0->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)local_a8);
      return;
    }
    makefile = (*ppcVar7)->Makefile;
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_68,
               &(*ppcVar7)->GeneratorTargets);
    for (ppcVar8 = local_68._M_impl.super__Vector_impl_data._M_start;
        ppcVar8 != local_68._M_impl.super__Vector_impl_data._M_finish; ppcVar8 = ppcVar8 + 1) {
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar8);
      std::__cxx11::string::string((string *)&local_d0,(string *)psVar5);
      TVar2 = cmGeneratorTarget::GetType(*ppcVar8);
      if (TVar2 < UTILITY) {
        AppendTarget(this,fout,&local_d0,*ppcVar7,*ppcVar8,local_a8[0],makefile,
                     in_stack_ffffffffffffff00,sourceFileFlags,false);
        std::__cxx11::string::string((string *)&local_50,(string *)&local_d0);
        std::__cxx11::string::append((char *)&local_50);
        AppendTarget(this,fout,&local_50,*ppcVar7,*ppcVar8,local_a8[0],makefile,
                     in_stack_ffffffffffffff00,sourceFileFlags,false);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else if (TVar2 == UTILITY) {
        lVar6 = std::__cxx11::string::find((char *)&local_d0,0x517791);
        if ((((lVar6 != 0) || (bVar1 = std::operator!=(&local_d0,"Nightly"), !bVar1)) &&
            ((lVar6 = std::__cxx11::string::find((char *)&local_d0,0x517799), lVar6 != 0 ||
             (bVar1 = std::operator!=(&local_d0,"Continuous"), !bVar1)))) &&
           ((lVar6 = std::__cxx11::string::find((char *)&local_d0,0x4f2415), lVar6 != 0 ||
            (bVar1 = std::operator!=(&local_d0,"Experimental"), !bVar1)))) {
LAB_003c8948:
          AppendTarget(this,fout,&local_d0,*ppcVar7,(cmGeneratorTarget *)0x0,local_a8[0],makefile,
                       in_stack_ffffffffffffff00,sourceFileFlags,false);
        }
      }
      else if (TVar2 == GLOBAL_TARGET) {
        pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory(*ppcVar7);
        __s2 = cmLocalGenerator::GetBinaryDirectory(*ppcVar7);
        iVar3 = strcmp(pcVar4,__s2);
        if (iVar3 == 0) goto LAB_003c8948;
      }
      std::__cxx11::string::~string((string *)&local_d0);
    }
    std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
              (&local_68);
    ppcVar7 = ppcVar7 + 1;
  } while( true );
}

Assistant:

void cmExtraSublimeTextGenerator::AppendAllTargets(
  const std::vector<cmLocalGenerator*>& lgs, const cmMakefile* mf,
  cmGeneratedFileStream& fout, MapSourceFileFlags& sourceFileFlags)
{
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string compiler;
  if (!lgs.empty()) {
    this->AppendTarget(fout, "all", lgs[0], CM_NULLPTR, make.c_str(), mf,
                       compiler.c_str(), sourceFileFlags, true);
    this->AppendTarget(fout, "clean", lgs[0], CM_NULLPTR, make.c_str(), mf,
                       compiler.c_str(), sourceFileFlags, false);
  }

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator lg = lgs.begin();
       lg != lgs.end(); lg++) {
    cmMakefile* makefile = (*lg)->GetMakefile();
    std::vector<cmGeneratorTarget*> targets = (*lg)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
         ti != targets.end(); ti++) {
      std::string targetName = (*ti)->GetName();
      switch ((*ti)->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (strcmp((*lg)->GetCurrentBinaryDirectory(),
                     (*lg)->GetBinaryDirectory()) == 0) {
            this->AppendTarget(fout, targetName, *lg, CM_NULLPTR, make.c_str(),
                               makefile, compiler.c_str(), sourceFileFlags,
                               false);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((targetName.find("Nightly") == 0) &&
               (targetName != "Nightly")) ||
              ((targetName.find("Continuous") == 0) &&
               (targetName != "Continuous")) ||
              ((targetName.find("Experimental") == 0) &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(fout, targetName, *lg, CM_NULLPTR, make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          this->AppendTarget(fout, targetName, *lg, *ti, make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
          std::string fastTarget = targetName;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, *lg, *ti, make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
        } break;
        default:
          break;
      }
    }
  }
}